

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeAddedConstants::doWalkFunction(OptimizeAddedConstants *this,Function *func)

{
  Module *pMVar1;
  LazyLocalGraph *this_00;
  Expression **root;
  pointer __p;
  undefined1 local_1d8 [392];
  Module *local_50;
  unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_> *local_48;
  Expression **local_40;
  Function *local_38;
  
  local_38 = func;
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
        ).super_Pass.runner)->options).lowMemoryUnused != false) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
             .
             super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
             .currModule;
    if ((pMVar1->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pMVar1->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_48 = &this->localGraph;
      root = &func->body;
      local_40 = root;
      while( true ) {
        this->propagated = false;
        std::
        _Rb_tree<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_int>,_std::_Select1st<std::pair<wasm::LocalSet_*const,_unsigned_int>_>,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
        ::clear(&(this->helperIndexes)._M_t);
        std::
        _Rb_tree<wasm::LocalSet_*,_wasm::LocalSet_*,_std::_Identity<wasm::LocalSet_*>,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
        ::clear(&(this->propagatable)._M_t);
        if (this->propagate == true) {
          local_50 = (this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                     ).
                     super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                     .
                     super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                     .currModule;
          this_00 = (LazyLocalGraph *)operator_new(0x170);
          LazyLocalGraph::LazyLocalGraph
                    (this_00,local_38,local_50,(optional<wasm::Expression::Id>)0x0);
          local_1d8._0_8_ =
               (__uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>)
               0x0;
          std::__uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
          reset((__uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_> *
                )local_48,this_00);
          std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
          ~unique_ptr((unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>
                       *)local_1d8);
          findPropagatable(this);
          root = local_40;
        }
        Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
        ::walk(&(this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                .
                super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
               ,root);
        if ((this->helperIndexes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          createHelperIndexes(this);
        }
        if (this->propagated != true) break;
        cleanUpAfterPropagation(this);
      }
    }
    return;
  }
  Fatal::Fatal((Fatal *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1d8 + 0x10),"OptimizeAddedConstants can only be run when the ",0x30);
  Fatal::operator<<((Fatal *)local_1d8,(char (*) [33])"--low-memory-unused flag is set.");
  Fatal::~Fatal((Fatal *)local_1d8);
}

Assistant:

void doWalkFunction(Function* func) {
    if (!getPassOptions().lowMemoryUnused) {
      Fatal() << "OptimizeAddedConstants can only be run when the "
              << "--low-memory-unused flag is set.";
    }

    if (getModule()->memories.empty()) {
      // There can be no loads and stores without a memory.
      return;
    }

    // Multiple passes may be needed if we have x + 4 + 8 etc. (nested structs
    // in C can cause this, but it's rare). Note that we only need that for the
    // propagation case (as 4 + 8 would be optimized directly if it were
    // adjacent).
    while (1) {
      propagated = false;
      helperIndexes.clear();
      propagatable.clear();
      if (propagate) {
        localGraph = std::make_unique<LazyLocalGraph>(func, getModule());
        findPropagatable();
      }
      Super::doWalkFunction(func);
      if (!helperIndexes.empty()) {
        createHelperIndexes();
      }
      if (propagated) {
        cleanUpAfterPropagation();
      } else {
        return;
      }
    }
  }